

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void __thiscall
CustomUintFormatter<2,true>::
Ser<ParamsStream<ParamsStream<HashedSourceWriter<AutoFile>&,CAddress::SerParams>&,CNetAddr::SerParams>,unsigned_short>
          (CustomUintFormatter<2,true> *this,
          ParamsStream<ParamsStream<HashedSourceWriter<AutoFile>_&,_CAddress::SerParams>_&,_CNetAddr::SerParams>
          *s,unsigned_short v)

{
  HashedSourceWriter<AutoFile> *this_00;
  size_t in_RCX;
  uint6 in_register_00000012;
  long in_FS_OFFSET;
  uint64_t raw;
  undefined8 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = ((ulong)in_register_00000012 & 0xff00) << 0x18 |
             ((ulong)in_register_00000012 & 0xff) << 0x28 | ((ulong)v & 0xff00) << 0x28 |
             CONCAT62(in_register_00000012,v) << 0x38;
  this_00 = s->m_substream->m_substream;
  AutoFile::write(this_00->m_source,(int)(uchar *)((long)&local_20 + 6),(void *)0x2,in_RCX);
  CSHA256::Write((CSHA256 *)this_00,(uchar *)((long)&local_20 + 6),2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, I v)
    {
        if (v < 0 || v > MAX) throw std::ios_base::failure("CustomUintFormatter value out of range");
        if (BigEndian) {
            uint64_t raw = htobe64_internal(v);
            s.write(AsBytes(Span{&raw, 1}).last(Bytes));
        } else {
            uint64_t raw = htole64_internal(v);
            s.write(AsBytes(Span{&raw, 1}).first(Bytes));
        }
    }